

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O1

int Gia_ManNameIsLegalInVerilog(char *pName)

{
  char cVar1;
  int iVar2;
  byte bVar3;
  byte *pbVar4;
  
  if (pName == (char *)0x0) {
LAB_0021c7a3:
    __assert_fail("pName != NULL && *pName != \'\\0\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMan.c"
                  ,0x4ca,"int Gia_ManNameIsLegalInVerilog(char *)");
  }
  cVar1 = *pName;
  iVar2 = 1;
  if (cVar1 != '\\') {
    if (cVar1 == '\0') goto LAB_0021c7a3;
    if (((byte)(cVar1 + 0x85U) < 0xe6) && (cVar1 != '_' && 0x19 < (byte)(cVar1 + 0xbfU))) {
LAB_0021c79f:
      iVar2 = 0;
    }
    else {
      bVar3 = pName[1];
      if (bVar3 != 0) {
        pbVar4 = (byte *)(pName + 2);
        do {
          if (((((byte)(bVar3 - 0x3a) < 0xf6) && ((byte)((bVar3 & 0xdf) + 0xa5) < 0xe6)) &&
              (bVar3 != 0x5f)) && (bVar3 != 0x24)) goto LAB_0021c79f;
          bVar3 = *pbVar4;
          pbVar4 = pbVar4 + 1;
        } while (bVar3 != 0);
      }
    }
  }
  return iVar2;
}

Assistant:

int Gia_ManNameIsLegalInVerilog( char * pName )
{
    // identifier ::= simple_identifier | escaped_identifier
    // simple_identifier ::= [a-zA-Z_][a-zA-Z0-9_$]
    // escaped_identifier ::= \ {Any_ASCII_character_except_white_space} white_space
    // white_space ::= space | tab | newline
    assert( pName != NULL && *pName != '\0' );
    if ( *pName == '\\' )
        return 1;
    if ( (*pName < 'a' || *pName > 'z') && (*pName < 'A' || *pName > 'Z') && *pName != '_' )
        return 0;
    while ( *(++pName) )
        if ( (*pName < 'a' || *pName > 'z') && (*pName < 'A' || *pName > 'Z') && (*pName < '0' || *pName > '9') && *pName != '_' && *pName != '$' ) 
            return 0;
    return 1;
}